

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O2

void __thiscall
imrt::ACO::ACO(ACO *this,vector<double,_std::allocator<double>_> *w,
              vector<double,_std::allocator<double>_> *Zmin,
              vector<double,_std::allocator<double>_> *Zmax,Collimator *_collimator,
              vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int _max_apertures,
              int max_intensity,int initial_intensity,int step_intensity,int _n_ants,
              double _initial_pheromone,double _alpha,double _beta,double _rho)

{
  Ant *pAVar1;
  int iVar2;
  double dVar3;
  double local_f8;
  Ant *aux;
  vector<double,_std::allocator<double>_> *local_e8;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *local_e0;
  vector<double,_std::allocator<double>_> *local_d8;
  vector<double,_std::allocator<double>_> *local_d0;
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  *local_c8;
  _Vector_base<double,_std::allocator<double>_> local_c0;
  _Vector_base<double,_std::allocator<double>_> local_a8;
  _Vector_base<double,_std::allocator<double>_> local_90;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  this->_vptr_ACO = (_func_int **)&PTR__ACO_0013ac18;
  this->n_ants = _n_ants;
  this->initial_pheromone = _initial_pheromone;
  local_c8 = &this->pheromone;
  local_e8 = (vector<double,_std::allocator<double>_> *)_alpha;
  local_e0 = volumes;
  local_d8 = Zmax;
  local_d0 = Zmin;
  memset(local_c8,0,0x90);
  this->alpha = (double)local_e8;
  this->beta = _beta;
  this->rho = _rho;
  (this->ants).super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ants).super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ants).super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->collimator = _collimator;
  this->max_apertures = _max_apertures;
  this->max_no_improvement = 100.0;
  initializePheromone(this);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_90,w);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_a8,local_d0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_c0,local_d8);
  local_e8 = w;
  initializeHeuristic(this,(vector<double,_std::allocator<double>_> *)&local_90,
                      (vector<double,_std::allocator<double>_> *)&local_a8,
                      (vector<double,_std::allocator<double>_> *)&local_c0,local_e0,max_intensity,
                      initial_intensity,step_intensity);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_90);
  local_f8 = 1.79769313486232e+308;
  for (iVar2 = 0; iVar2 < this->n_ants; iVar2 = iVar2 + 1) {
    pAVar1 = (Ant *)operator_new(0x50);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,local_e8);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_60,local_d0);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_78,local_d8);
    Ant::Ant(pAVar1,(vector<double,_std::allocator<double>_> *)&local_48,
             (vector<double,_std::allocator<double>_> *)&local_60,
             (vector<double,_std::allocator<double>_> *)&local_78,this->collimator,local_e0,
             this->max_apertures,max_intensity,initial_intensity,step_intensity);
    aux = pAVar1;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    std::vector<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>::push_back(&this->ants,&aux);
    dVar3 = Ant::getEvaluation(aux);
    if (dVar3 < local_f8) {
      local_f8 = Ant::getEvaluation(aux);
      this->iteration_best = aux;
    }
  }
  evaporation(this);
  globalDeposit(this,this->iteration_best);
  pAVar1 = (Ant *)operator_new(0x50);
  Ant::Ant(pAVar1,this->iteration_best);
  this->global_best = pAVar1;
  return;
}

Assistant:

ACO (vector<double> w, vector<double> Zmin, vector<double> Zmax, Collimator& _collimator,
       vector<Volume>& volumes, int _max_apertures, int max_intensity, int initial_intensity,
       int step_intensity, int _n_ants, double _initial_pheromone, double _alpha, double _beta, 
       double _rho): collimator(_collimator), max_apertures(_max_apertures), n_ants(_n_ants), 
        initial_pheromone(_initial_pheromone), alpha(_alpha), beta(_beta), rho(_rho) {
  
    Ant * aux;
    double initial_best = DBL_MAX;
    
    initializePheromone();
    initializeHeuristic(w,Zmin, Zmax, volumes, max_intensity, initial_intensity, step_intensity);
    
    for (int i=0; i < n_ants; i++) {
      aux = new Ant(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity);
      ants.push_back(aux);
      if (initial_best > aux->getEvaluation()) {
        initial_best = aux->getEvaluation();
        iteration_best = aux;
      }
    }
    evaporation();
    globalDeposit (iteration_best);
    global_best =new Ant (*iteration_best);
    
    
  }